

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_case_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundCaseExpression::Copy(BoundCaseExpression *this)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  _Head_base<0UL,_duckdb::Expression_*,_false> _Var2;
  undefined8 uVar3;
  element_type *peVar4;
  BoundCaseExpression *this_00;
  pointer pEVar5;
  pointer pBVar6;
  pointer *__ptr;
  Expression *in_RSI;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  LogicalType local_68;
  _Head_base<0UL,_duckdb::Expression_*,_false> local_48;
  _Head_base<0UL,_duckdb::BoundCaseExpression_*,_false> local_40;
  __uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_> local_38;
  
  local_38._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl =
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
       (tuple<duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)this;
  this_00 = (BoundCaseExpression *)operator_new(0x78);
  LogicalType::LogicalType(&local_68,&in_RSI->return_type);
  BoundCaseExpression(this_00,&local_68);
  local_40._M_head_impl = this_00;
  LogicalType::~LogicalType(&local_68);
  this_01 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
            in_RSI[1].super_BaseExpression._vptr_BaseExpression;
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            &in_RSI[1].super_BaseExpression.type;
  if (this_01 != puVar1) {
    do {
      local_68._0_8_ = (Expression *)0x0;
      local_68.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_48,pEVar5);
      _Var2._M_head_impl = local_48._M_head_impl;
      uVar3 = local_68._0_8_;
      local_48._M_head_impl = (Expression *)0x0;
      local_68._0_8_ = _Var2._M_head_impl;
      if ((Expression *)uVar3 != (Expression *)0x0) {
        (**(code **)(*(long *)uVar3 + 8))();
        if (local_48._M_head_impl != (Expression *)0x0) {
          (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01 + 1);
      (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0x11])(&local_48,pEVar5);
      _Var2._M_head_impl = local_48._M_head_impl;
      peVar4 = local_68.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_48._M_head_impl = (Expression *)0x0;
      local_68.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)_Var2._M_head_impl;
      if ((Expression *)peVar4 != (Expression *)0x0) {
        (*peVar4->_vptr_ExtraTypeInfo[1])();
        if (local_48._M_head_impl != (Expression *)0x0) {
          (*((local_48._M_head_impl)->super_BaseExpression)._vptr_BaseExpression[1])();
        }
      }
      pBVar6 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
               ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                             *)&local_40);
      ::std::vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>::
      emplace_back<duckdb::BoundCaseCheck>
                (&(pBVar6->case_checks).
                  super_vector<duckdb::BoundCaseCheck,_std::allocator<duckdb::BoundCaseCheck>_>,
                 (BoundCaseCheck *)&local_68);
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_68.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (Expression *)0x0) {
        (*(local_68.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          _vptr_ExtraTypeInfo[1])();
      }
      local_68.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      if ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
          local_68._0_8_ != (Expression *)0x0) {
        (**(code **)((long)((BaseExpression *)local_68._0_8_)->_vptr_BaseExpression + 8))();
      }
      this_01 = this_01 + 2;
    } while (this_01 != puVar1);
  }
  pEVar5 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator->
                     ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>
                       *)&in_RSI[1].super_BaseExpression.alias._M_string_length);
  (*(pEVar5->super_BaseExpression)._vptr_BaseExpression[0x11])
            ((_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_> *)
             &local_68,pEVar5);
  pBVar6 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                         *)&local_40);
  uVar3 = local_68._0_8_;
  local_68._0_8_ = (Expression *)0x0;
  _Var2._M_head_impl =
       (pBVar6->else_expr).
       super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
       super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
  (pBVar6->else_expr).super_unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>
  ._M_t.super___uniq_ptr_impl<duckdb::Expression,_std::default_delete<duckdb::Expression>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
  super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = (Expression *)uVar3;
  if (_Var2._M_head_impl != (Expression *)0x0) {
    (**(code **)(*(long *)&(_Var2._M_head_impl)->super_BaseExpression + 8))();
    if ((_Head_base<0UL,_duckdb::Expression_*,_false>)local_68._0_8_ !=
        (_Head_base<0UL,_duckdb::Expression_*,_false>)0x0) {
      (**(code **)(*(long *)local_68._0_8_ + 8))();
    }
  }
  pBVar6 = unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
           ::operator->((unique_ptr<duckdb::BoundCaseExpression,_std::default_delete<duckdb::BoundCaseExpression>,_true>
                         *)&local_40);
  Expression::CopyProperties(&pBVar6->super_Expression,in_RSI);
  *(BoundCaseExpression **)
   local_38._M_t.
   super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
   super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl = local_40._M_head_impl;
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (_Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>)
         local_38._M_t.
         super__Tuple_impl<0UL,_duckdb::Expression_*,_std::default_delete<duckdb::Expression>_>.
         super__Head_base<0UL,_duckdb::Expression_*,_false>._M_head_impl;
}

Assistant:

unique_ptr<Expression> BoundCaseExpression::Copy() const {
	auto new_case = make_uniq<BoundCaseExpression>(return_type);
	for (auto &check : case_checks) {
		BoundCaseCheck new_check;
		new_check.when_expr = check.when_expr->Copy();
		new_check.then_expr = check.then_expr->Copy();
		new_case->case_checks.push_back(std::move(new_check));
	}
	new_case->else_expr = else_expr->Copy();

	new_case->CopyProperties(*this);
	return std::move(new_case);
}